

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall
wabt::OptionParser::HandleArgument(OptionParser *this,size_t *arg_index,char *arg_value)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  Argument *argument;
  char *arg_value_local;
  size_t *arg_index_local;
  OptionParser *this_local;
  
  uVar1 = *arg_index;
  sVar2 = std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::
          size(&this->arguments_);
  if (uVar1 < sVar2) {
    pvVar3 = std::
             vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::
             operator[](&this->arguments_,*arg_index);
    std::function<void_(const_char_*)>::operator()(&pvVar3->callback,arg_value);
    pvVar3->handled_count = pvVar3->handled_count + 1;
    if (pvVar3->count == One) {
      *arg_index = *arg_index + 1;
    }
  }
  else {
    Errorf(this,"unexpected argument \'%s\'",arg_value);
  }
  return;
}

Assistant:

void OptionParser::HandleArgument(size_t* arg_index, const char* arg_value) {
  if (*arg_index >= arguments_.size()) {
    Errorf("unexpected argument '%s'", arg_value);
    return;
  }
  Argument& argument = arguments_[*arg_index];
  argument.callback(arg_value);
  argument.handled_count++;

  if (argument.count == ArgumentCount::One) {
    (*arg_index)++;
  }
}